

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

int __thiscall trackerboy::Player::progressMax(Player *this)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_stoneface86[P]trackerboy_build_O0__deps_libtrackerboy_src_src_export_Player_cpp:90:23),_const_std::variant<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>_&>
  _Var1;
  anon_class_1_0_00000001 local_11;
  Player *local_10;
  Player *this_local;
  
  local_10 = this;
  _Var1 = std::
          visit<trackerboy::Player::progressMax()const::__0,std::variant<std::monostate,trackerboy::Player::LoopContext,trackerboy::Player::DurationContext>const&>
                    (&local_11,&this->mContext);
  return _Var1;
}

Assistant:

int Player::progressMax() const {
    return std::visit([](auto&& ctx) {
        using T = std::decay_t<decltype(ctx)>;

        if constexpr (std::is_same_v<T, LoopContext>) {
            return ctx.loopAmount;
        } else if constexpr (std::is_same_v<T, DurationContext>) {
            return ctx.framesToPlay;
        } else {
            return 0;
        }
    }, mContext);
}